

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTDMT_jobDescription * ZSTDMT_createJobsTable(U32 *nbJobsPtr,ZSTD_customMem cMem)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ZSTDMT_jobDescription *jobTable;
  uint uVar4;
  uint uVar5;
  size_t __size;
  ulong uVar6;
  pthread_cond_t *__cond;
  
  uVar4 = *nbJobsPtr;
  if (uVar4 == 0) {
    __assert_fail("val != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x12c2,"U32 ZSTD_highbit32(U32)");
  }
  iVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  uVar4 = 2 << ((byte)iVar1 & 0x1f);
  __size = 0x178L << (-(((byte)iVar1 ^ 0x1f) + 0x20) & 0x3f);
  if (cMem.customAlloc == (ZSTD_allocFunction)0x0) {
    jobTable = (ZSTDMT_jobDescription *)calloc(1,__size);
  }
  else {
    jobTable = (ZSTDMT_jobDescription *)(*cMem.customAlloc)(cMem.opaque,__size);
    memset(jobTable,0,__size);
  }
  uVar5 = 0;
  if (jobTable != (ZSTDMT_jobDescription *)0x0) {
    *nbJobsPtr = uVar4;
    uVar6 = (ulong)uVar4;
    __cond = (pthread_cond_t *)&jobTable->job_cond;
    do {
      uVar2 = pthread_mutex_init((pthread_mutex_t *)((long)__cond + -0x28),
                                 (pthread_mutexattr_t *)0x0);
      uVar3 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
      uVar5 = uVar5 | uVar2 | uVar3;
      __cond = (pthread_cond_t *)((long)__cond + 0x178);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    if (uVar5 == 0) {
      return jobTable;
    }
    ZSTDMT_freeJobsTable(jobTable,uVar4,cMem);
  }
  return (ZSTDMT_jobDescription *)0x0;
}

Assistant:

static ZSTDMT_jobDescription* ZSTDMT_createJobsTable(U32* nbJobsPtr, ZSTD_customMem cMem)
{
    U32 const nbJobsLog2 = ZSTD_highbit32(*nbJobsPtr) + 1;
    U32 const nbJobs = 1 << nbJobsLog2;
    U32 jobNb;
    ZSTDMT_jobDescription* const jobTable = (ZSTDMT_jobDescription*)
                ZSTD_calloc(nbJobs * sizeof(ZSTDMT_jobDescription), cMem);
    int initError = 0;
    if (jobTable==NULL) return NULL;
    *nbJobsPtr = nbJobs;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        initError |= ZSTD_pthread_mutex_init(&jobTable[jobNb].job_mutex, NULL);
        initError |= ZSTD_pthread_cond_init(&jobTable[jobNb].job_cond, NULL);
    }
    if (initError != 0) {
        ZSTDMT_freeJobsTable(jobTable, nbJobs, cMem);
        return NULL;
    }
    return jobTable;
}